

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_insertproxymodel.cpp
# Opt level: O2

void __thiscall tst_InsertProxyModel::testNullModel(tst_InsertProxyModel *this)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  ModelTest *this_00;
  int iVar4;
  anon_union_24_3_e3d07ef4_for_data local_f8;
  undefined1 local_d8 [24];
  InsertProxyModel proxyModel;
  QModelIndex local_a8;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_68;
  QStringListModel validModel;
  QArrayDataPointer<char16_t> local_28;
  
  InsertProxyModel::InsertProxyModel(&proxyModel,(QObject *)0x0);
  this_00 = (ModelTest *)operator_new(0x10);
  ModelTest::ModelTest(this_00,(QAbstractItemModel *)&proxyModel,&this->super_QObject);
  _validModel = 1;
  InsertProxyModel::setInsertDirection(&proxyModel);
  InsertProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
  local_d8._0_8_ = (Data *)0xffffffffffffffff;
  local_d8._8_8_ = (char16_t *)0x0;
  local_d8._16_8_ = 0;
  iVar4 = (int)&local_f8;
  InsertProxyModel::index(iVar4,(int)&proxyModel,(QModelIndex *)0x0);
  local_a8.r = 0;
  local_a8.c = 0;
  local_a8.i = 0x11f7d0;
  local_a8.m = (QAbstractItemModel *)0x1;
  local_68.d = (Data *)0x0;
  local_68.ptr = (char16_t *)0x0;
  local_68.size = 0;
  QVariant::QVariant((QVariant *)&validModel,(QString *)&local_a8);
  bVar1 = InsertProxyModel::setData
                    ((QModelIndex *)&proxyModel,(QVariant *)&local_f8,(int)&validModel);
  cVar2 = QTest::qVerify((bool)(bVar1 ^ 1),
                         "!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral(\"1\"))","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                         ,0x1df);
  QVariant::~QVariant((QVariant *)&validModel);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  if (cVar2 != '\0') {
    local_d8._0_8_ = (PrivateShared *)0xffffffffffffffff;
    local_d8._8_8_ = (char16_t *)0x0;
    local_d8._16_8_ = 0;
    InsertProxyModel::index(iVar4,(int)&proxyModel,(QModelIndex *)0x0);
    QModelIndex::data((QVariant *)&validModel,(QModelIndex *)&local_f8,0);
    bVar3 = QVariant::isValid((QVariant *)&validModel);
    cVar2 = QTest::qVerify(!bVar3,"!proxyModel.index(0, 0).data().isValid()","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                           ,0x1e0);
    QVariant::~QVariant((QVariant *)&validModel);
    if (cVar2 != '\0') {
      bVar1 = InsertProxyModel::commitRow();
      cVar2 = QTest::qVerify((bool)(bVar1 ^ 1),"!proxyModel.commitRow()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                             ,0x1e1);
      if (cVar2 != '\0') {
        local_f8._16_8_ = 0;
        local_d8._0_8_ = (PrivateShared *)0x0;
        local_f8.shared = (PrivateShared *)0x0;
        local_f8._8_8_ = 0;
        local_d8._8_8_ = L"1";
        local_d8._16_8_ = 1;
        local_a8.r = 0;
        local_a8.c = 0;
        local_a8.i = 0;
        local_a8.m = (QAbstractItemModel *)0x0;
        QList<QString>::emplaceBack<QString>((QList<QString> *)&local_f8,(QString *)local_d8);
        QStringListModel::QStringListModel(&validModel,(QList *)local_f8.data,(QObject *)0x0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&local_f8);
        InsertProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
        local_a8.r = -1;
        local_a8.c = -1;
        local_a8.i = 0;
        local_a8.m = (QAbstractItemModel *)0x0;
        InsertProxyModel::index((int)local_d8,(int)&proxyModel,(QModelIndex *)0x1);
        local_68.d = (Data *)0x0;
        local_68.ptr = L"2";
        local_68.size = 1;
        local_88.d = (Data *)0x0;
        local_88.ptr = (char16_t *)0x0;
        local_88.size = 0;
        QVariant::QVariant((QVariant *)&local_f8,(QString *)&local_68);
        bVar3 = (bool)InsertProxyModel::setData
                                ((QModelIndex *)&proxyModel,(QVariant *)local_d8,iVar4);
        cVar2 = QTest::qVerify(bVar3,
                               "proxyModel.setData(proxyModel.index(1, 0), QStringLiteral(\"2\"))",
                               "",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                               ,0x1e4);
        QVariant::~QVariant((QVariant *)&local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
        if (cVar2 != '\0') {
          local_68.d = (Data *)0xffffffffffffffff;
          local_68.ptr = (char16_t *)0x0;
          local_68.size = 0;
          InsertProxyModel::index((int)&local_a8,(int)&proxyModel,(QModelIndex *)0x1);
          QModelIndex::data((QVariant *)&local_f8,&local_a8,0);
          QVariant::toString();
          local_88.d = (Data *)0x0;
          local_88.ptr = L"2";
          local_88.size = 1;
          local_28.d = (Data *)0x0;
          local_28.ptr = (char16_t *)0x0;
          local_28.size = 0;
          bVar3 = QTest::qCompare((QString *)local_d8,(QString *)&local_88,
                                  "proxyModel.index(1, 0).data().toString()","QStringLiteral(\"2\")"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                  ,0x1e5);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
          QVariant::~QVariant((QVariant *)&local_f8);
          if (bVar3) {
            bVar3 = (bool)InsertProxyModel::commitRow();
            cVar2 = QTest::qVerify(bVar3,"proxyModel.commitRow()","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                   ,0x1e6);
            if (cVar2 != '\0') {
              local_68.d = (Data *)0xffffffffffffffff;
              local_68.ptr = (char16_t *)0x0;
              local_68.size = 0;
              QAbstractListModel::index((int)&local_a8,(int)&validModel,(QModelIndex *)0x1);
              QModelIndex::data((QVariant *)&local_f8,&local_a8,0);
              QVariant::toString();
              local_88.d = (Data *)0x0;
              local_88.ptr = L"2";
              local_88.size = 1;
              local_28.d = (Data *)0x0;
              local_28.ptr = (char16_t *)0x0;
              local_28.size = 0;
              bVar3 = QTest::qCompare((QString *)local_d8,(QString *)&local_88,
                                      "validModel.index(1, 0).data().toString()",
                                      "QStringLiteral(\"2\")",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                      ,0x1e7);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
              QArrayDataPointer<char16_t>::~QArrayDataPointer
                        ((QArrayDataPointer<char16_t> *)local_d8);
              QVariant::~QVariant((QVariant *)&local_f8);
              if (bVar3) {
                InsertProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
                local_a8.r = -1;
                local_a8.c = -1;
                local_a8.i = 0;
                local_a8.m = (QAbstractItemModel *)0x0;
                InsertProxyModel::index((int)local_d8,(int)&proxyModel,(QModelIndex *)0x0);
                QModelIndex::data((QVariant *)&local_f8,(QModelIndex *)local_d8,0);
                bVar3 = QVariant::isValid((QVariant *)&local_f8);
                cVar2 = QTest::qVerify(!bVar3,"!proxyModel.index(0, 0).data().isValid()","",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                       ,0x1e9);
                QVariant::~QVariant((QVariant *)&local_f8);
                if (cVar2 != '\0') {
                  local_a8.r = -1;
                  local_a8.c = -1;
                  local_a8.i = 0;
                  local_a8.m = (QAbstractItemModel *)0x0;
                  InsertProxyModel::index((int)local_d8,(int)&proxyModel,(QModelIndex *)0x0);
                  local_68.d = (Data *)0x0;
                  local_68.ptr = L"3";
                  local_68.size = 1;
                  local_88.d = (Data *)0x0;
                  local_88.ptr = (char16_t *)0x0;
                  local_88.size = 0;
                  QVariant::QVariant((QVariant *)&local_f8,(QString *)&local_68);
                  bVar1 = InsertProxyModel::setData
                                    ((QModelIndex *)&proxyModel,(QVariant *)local_d8,iVar4);
                  cVar2 = QTest::qVerify((bool)(bVar1 ^ 1),
                                         "!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral(\"3\"))"
                                         ,"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                         ,0x1ea);
                  QVariant::~QVariant((QVariant *)&local_f8);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
                  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
                  if (cVar2 != '\0') {
                    local_a8.r = -1;
                    local_a8.c = -1;
                    local_a8.i = 0;
                    local_a8.m = (QAbstractItemModel *)0x0;
                    InsertProxyModel::index((int)local_d8,(int)&proxyModel,(QModelIndex *)0x0);
                    QModelIndex::data((QVariant *)&local_f8,(QModelIndex *)local_d8,0);
                    bVar3 = QVariant::isValid((QVariant *)&local_f8);
                    cVar2 = QTest::qVerify(!bVar3,"!proxyModel.index(0, 0).data().isValid()","",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                           ,0x1eb);
                    QVariant::~QVariant((QVariant *)&local_f8);
                    if (cVar2 != '\0') {
                      bVar1 = InsertProxyModel::commitRow();
                      QTest::qVerify((bool)(bVar1 ^ 1),"!proxyModel.commitRow()","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_InsertProxyModel/tst_insertproxymodel.cpp"
                                     ,0x1ec);
                    }
                  }
                }
              }
            }
          }
        }
        QStringListModel::~QStringListModel(&validModel);
      }
    }
  }
  InsertProxyModel::~InsertProxyModel(&proxyModel);
  return;
}

Assistant:

void tst_InsertProxyModel::testNullModel()
{
    InsertProxyModel proxyModel;
    new ModelTest(&proxyModel, this);
    proxyModel.setInsertDirection(InsertProxyModel::InsertRow);
    proxyModel.setSourceModel(nullptr);
    QVERIFY(!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral("1")));
    QVERIFY(!proxyModel.index(0, 0).data().isValid());
    QVERIFY(!proxyModel.commitRow());
    QStringListModel validModel(QStringList() << QStringLiteral("1"));
    proxyModel.setSourceModel(&validModel);
    QVERIFY(proxyModel.setData(proxyModel.index(1, 0), QStringLiteral("2")));
    QCOMPARE(proxyModel.index(1, 0).data().toString(), QStringLiteral("2"));
    QVERIFY(proxyModel.commitRow());
    QCOMPARE(validModel.index(1, 0).data().toString(), QStringLiteral("2"));
    proxyModel.setSourceModel(nullptr);
    QVERIFY(!proxyModel.index(0, 0).data().isValid());
    QVERIFY(!proxyModel.setData(proxyModel.index(0, 0), QStringLiteral("3")));
    QVERIFY(!proxyModel.index(0, 0).data().isValid());
    QVERIFY(!proxyModel.commitRow());
}